

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  AcceptingStates AVar2;
  int iVar3;
  duration<long,_std::ratio<1L,_1000L>_> *pdVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined4 in_register_00000034;
  error_code ec;
  milliseconds tcount;
  bool bindsuccess;
  AcceptingStates exp;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  duration<long,std::ratio<1l,1000l>> local_68 [8];
  memory_order in_stack_ffffffffffffffa0;
  AcceptingStates in_stack_ffffffffffffffa4;
  AcceptingStates *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  strong_ordering in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffbc;
  error_category *in_stack_ffffffffffffffd0;
  undefined1 local_28 [11];
  undefined1 local_1d;
  undefined4 local_1c;
  TcpAcceptor *local_18;
  undefined8 local_10;
  bool local_1;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_18 = this;
  AVar2 = std::atomic::operator_cast_to_AcceptingStates
                    ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)0x7ec4c3);
  if (AVar2 == HALTED) {
    std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::operator=
              ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (AcceptingStates)((ulong)this >> 0x20));
  }
  local_1c = 0;
  uVar6 = 5;
  bVar1 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::compare_exchange_strong
                    ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)
                     CONCAT17(in_stack_ffffffffffffffb7._M_value,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_1d = 0;
    pdVar4 = (duration<long,_std::ratio<1L,_1000L>_> *)memset(local_28,0,8);
    while (uVar5 = CONCAT71((int7)((ulong)pdVar4 >> 8),local_1d) ^ 0xff, (uVar5 & 1) != 0) {
      CLI::std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      iVar3 = asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::bind
                        (&this->acceptor_,(int)this + 0x10,(sockaddr *)&stack0xffffffffffffffc8,
                         (socklen_t)uVar6);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffc8);
      if (bVar1) {
        in_stack_ffffffffffffffb7 =
             std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                       ((duration<long,_std::ratio<1L,_1000L>_> *)
                        CONCAT44(in_stack_ffffffffffffffbc,iVar3),
                        (duration<long,_std::ratio<1L,_1000L>_> *)
                        CONCAT17(in_stack_ffffffffffffffb7._M_value,in_stack_ffffffffffffffb0));
        std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xffffffffffffffb6,(__unspec *)0x0);
        bVar1 = std::operator>(in_stack_ffffffffffffffb7._M_value);
        if (bVar1) {
          AVar2 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::operator=
                            ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (AcceptingStates)((ulong)this >> 0x20));
          uVar5 = (ulong)AVar2;
          break;
        }
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffa8,
                   (int *)&stack0xffffffffffffffa4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffff94 = 200;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  (local_68,(int *)&stack0xffffffffffffff94);
        pdVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
                           ((duration<long,_std::ratio<1L,_1000L>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (duration<long,_std::ratio<1L,_1000L>_> *)this);
      }
      else {
        AVar2 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::operator=
                          ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (AcceptingStates)((ulong)this >> 0x20));
        pdVar4 = (duration<long,_std::ratio<1L,_1000L>_> *)(ulong)AVar2;
        local_1d = 1;
      }
    }
    uVar5 = CONCAT71((int7)(uVar5 >> 8),local_1d) & 0xffffffffffffff01;
    local_1 = SUB81(uVar5,0);
  }
  else {
    AVar2 = std::atomic::operator_cast_to_AcceptingStates
                      ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)0x7ec637);
    local_1 = AVar2 == CONNECTED;
    uVar5 = (ulong)CONCAT31((int3)(AVar2 >> 8),local_1);
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),local_1);
}

Assistant:

bool TcpAcceptor::connect(std::chrono::milliseconds timeOut)
{
    if (state == AcceptingStates::HALTED) {
        state = AcceptingStates::OPENED;
    }
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        bool bindsuccess = false;
        std::chrono::milliseconds tcount{0};
        while (!bindsuccess) {
            std::error_code ec;
            acceptor_.bind(endpoint_, ec);
            if (ec) {
                if (tcount > timeOut) {
                    state = AcceptingStates::OPENED;
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                tcount += std::chrono::milliseconds(200);
            } else {
                state = AcceptingStates::CONNECTED;
                bindsuccess = true;
            }
        }
        return bindsuccess;
    }
    return (state == AcceptingStates::CONNECTED);
}